

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qduplicatetracker_p.h
# Opt level: O2

void __thiscall
QDuplicateTracker<QString,_32UL>::QDuplicateTracker
          (QDuplicateTracker<QString,_32UL> *this,qsizetype n)

{
  long in_FS_OFFSET;
  allocator_type local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  std::pmr::monotonic_buffer_resource::monotonic_buffer_resource(&this->res,this,0x600);
  local_28._M_resource = (memory_resource *)&this->res;
  std::
  unordered_set<QString,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::equal_to<QString>,_std::pmr::polymorphic_allocator<QString>_>
  ::unordered_set(&this->set,n,&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit QDuplicateTracker(qsizetype n)
#ifdef __cpp_lib_memory_resource
        : set{size_t(n), &res}
#else
        : set{n}
#endif
    {}